

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<std::array<bfy_iovec,2ul>,void>
               (array<bfy_iovec,_2UL> *container,ostream *os)

{
  const_iterator pvVar1;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  array<bfy_iovec,_2UL> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  array<bfy_iovec,_2UL> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (array<bfy_iovec,_2UL> *)0x0;
  __end0 = std::array<bfy_iovec,_2UL>::begin(container);
  pvVar1 = std::array<bfy_iovec,_2UL>::end(container);
  do {
    if (__end0 == pvVar1) {
LAB_00155b57:
      if (__range3 != (array<bfy_iovec,_2UL> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((__range3 != (array<bfy_iovec,_2UL> *)0x0) &&
       (std::operator<<(os,','), __range3 == (array<bfy_iovec,_2UL> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_00155b57;
    }
    std::operator<<(os,' ');
    UniversalPrint<bfy_iovec>(__end0,os);
    __range3 = (array<bfy_iovec,_2UL> *)((long)&__range3->_M_elems[0].iov_base + 1);
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }